

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  size_t sVar1;
  ostream *poVar2;
  ostream *in_RCX;
  uint *puVar3;
  long lVar4;
  char *pcVar5;
  Name name;
  char local_2c [4];
  
  local_2c[3] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2c + 3,1);
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"export ",7);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  poVar2 = this->o;
  pcVar5 = (curr->name).super_IString.str._M_str;
  local_2c[2] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2c + 2,1);
  Colors::outputColorCode(poVar2,"\x1b[32m");
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar1);
  }
  Colors::outputColorCode(poVar2,"\x1b[0m");
  local_2c[1] = 0x22;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2c + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  puVar3 = &switchD_0084d36c::switchdataD_00b95710;
  switch(curr->kind) {
  case Function:
    poVar2 = this->o;
    pcVar5 = "func";
    lVar4 = 4;
    break;
  case Table:
    poVar2 = this->o;
    pcVar5 = "table";
    lVar4 = 5;
    break;
  case Memory:
    poVar2 = this->o;
    pcVar5 = "memory";
    goto LAB_0084d3b7;
  case Global:
    poVar2 = this->o;
    pcVar5 = "global";
LAB_0084d3b7:
    lVar4 = 6;
    break;
  case Tag:
    poVar2 = this->o;
    pcVar5 = "tag";
    lVar4 = 3;
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                       ,0xbfe);
  default:
    goto switchD_0084d36c_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  in_RCX = (ostream *)puVar3;
switchD_0084d36c_default:
  local_2c[0] = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2c,1);
  poVar2 = this->o;
  name.super_IString.str._M_str = (char *)poVar2;
  name.super_IString.str._M_len = (size_t)(curr->value).super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->value).super_IString.str._M_len,name,in_RCX);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"))",2);
  return;
}

Assistant:

void visitExport(Export* curr) {
    o << '(';
    printMedium(o, "export ");
    // TODO: Escape the string properly.
    printText(o, curr->name.str.data()) << " (";
    switch (curr->kind) {
      case ExternalKind::Function:
        o << "func";
        break;
      case ExternalKind::Table:
        o << "table";
        break;
      case ExternalKind::Memory:
        o << "memory";
        break;
      case ExternalKind::Global:
        o << "global";
        break;
      case ExternalKind::Tag:
        o << "tag";
        break;
      case ExternalKind::Invalid:
        WASM_UNREACHABLE("invalid ExternalKind");
    }
    o << ' ';
    printName(curr->value, o) << "))";
  }